

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O3

CURLcode Curl_creader_add(Curl_easy *data,Curl_creader *reader)

{
  CURLcode CVar1;
  Curl_creader *pCVar2;
  Curl_creader *pCVar3;
  Curl_creader **ppCVar4;
  
  ppCVar4 = &(data->req).reader_stack;
  pCVar3 = (data->req).reader_stack;
  if (pCVar3 == (Curl_creader *)0x0) {
    CVar1 = Curl_creader_set_fread(data,(data->state).infilesize);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    pCVar3 = *ppCVar4;
    if (pCVar3 == (Curl_creader *)0x0) {
      pCVar3 = (Curl_creader *)0x0;
      goto LAB_0015064b;
    }
  }
  if (pCVar3->phase < reader->phase) {
    do {
      pCVar2 = pCVar3;
      pCVar3 = pCVar2->next;
      if (pCVar3 == (Curl_creader *)0x0) {
        pCVar3 = (Curl_creader *)0x0;
        break;
      }
    } while (pCVar3->phase < reader->phase);
    ppCVar4 = &pCVar2->next;
  }
LAB_0015064b:
  reader->next = pCVar3;
  *ppCVar4 = reader;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_creader_add(struct Curl_easy *data,
                          struct Curl_creader *reader)
{
  CURLcode result;
  struct Curl_creader **anchor = &data->req.reader_stack;

  if(!*anchor) {
    result = Curl_creader_set_fread(data, data->state.infilesize);
    if(result)
      return result;
  }

  /* Insert the writer as first in its phase.
   * Skip existing readers of lower phases. */
  while(*anchor && (*anchor)->phase < reader->phase)
    anchor = &((*anchor)->next);
  reader->next = *anchor;
  *anchor = reader;
  return CURLE_OK;
}